

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

TestCase *
deqp::gles31::Functional::anon_unknown_0::createAdvancedEqDiffTest
          (Context *context,PrePost prepost,char *name,BlendState *commonState,
          BlendState *drawBufferState)

{
  char *pcVar1;
  bool *pbVar2;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar3;
  BlendFunc *pBVar4;
  undefined1 auVar5 [8];
  DrawBuffersIndexedTest *this;
  undefined1 uVar6;
  string *this_00;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers_1;
  BlendState preState;
  BlendState emptyState;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  Context *local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  Maybe<tcu::Vector<bool,_4>_> local_190;
  undefined1 local_180 [8];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *local_158;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_138;
  BlendState local_100;
  BlendState local_98;
  
  local_1b0._0_4_ = 0;
  local_1b0._4_4_ = 0;
  local_100.enableBlend.m_ptr = (bool *)0x0;
  local_180 = (undefined1  [8])0x0;
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1b8 = context;
  BlendState::BlendState
            (&local_98,(Maybe<bool> *)local_1b0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&local_100,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_180,(Maybe<tcu::Vector<bool,_4>_> *)&local_1f8);
  if (prepost == PRE) {
    pbVar2 = (commonState->enableBlend).m_ptr;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8._M_string_length;
    if (pbVar2 == (bool *)0x0) {
      uVar6 = 1;
    }
    else {
      uVar6 = *pbVar2;
    }
    local_1f8._M_string_length = CONCAT71(local_1f8._M_string_length._1_7_,uVar6);
    pEVar3 = (commonState->blendFunc).m_ptr;
    if (pEVar3 == (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      local_1b0._8_8_ = &local_1a0;
      local_1b0[0] = 1;
      local_1a0._M_allocated_capacity = 0x100000001;
      local_178[0] = '\x01';
      local_168._M_allocated_capacity._0_4_ = 1;
      local_168._M_allocated_capacity._4_4_ = 1;
    }
    else {
      local_178[0] = pEVar3->m_isFirst;
      pBVar4 = (pEVar3->field_1).m_first;
      if ((bool)local_178[0] == true) {
        local_168._M_allocated_capacity = (size_type)*pBVar4;
      }
      else {
        local_168._M_allocated_capacity = (size_type)*pBVar4;
        local_168._8_8_ = pBVar4[1];
      }
    }
    local_178._8_8_ = &local_168;
    local_180 = (undefined1  [8])(local_180 + 8);
    local_1d8._M_dataplus._M_p = (pointer)0x0;
    BlendState::BlendState
              (&local_100,(Maybe<bool> *)&local_1f8,&commonState->blendEq,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_180,(Maybe<tcu::Vector<bool,_4>_> *)&local_1d8);
    auVar5 = local_180;
    if (local_180 != (undefined1  [8])0x0) {
      *(char *)local_180 = '\x01';
      pcVar1 = (char *)((long)auVar5 + 8);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    local_1d8._M_dataplus._M_p = (pointer)0x0;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_allocated_capacity = 0;
    local_1f8._M_dataplus._M_p = (pointer)0x4000000040;
    local_190.m_ptr = (Vector<bool,_4> *)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_180,true,(IVec2 *)&local_1f8,drawBufferState,
               (TextureFormat *)&local_190);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)&local_1d8,(DrawBufferInfo *)local_180);
    if (local_138 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_138->m_isFirst = true;
      (local_138->field_1).m_first = (BlendFunc *)0x0;
    }
    if (local_158 !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      local_158->m_isFirst = true;
      (local_158->field_1).m_first = (uint *)0x0;
    }
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_180,name,(allocator<char> *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,name,&local_1f9);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,local_1b8,&local_100,&local_98,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                *)&local_1d8,(string *)local_180,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != (undefined1  [8])(local_178 + 8)) {
      operator_delete((void *)local_180,(ulong)(local_178._8_8_ + 1));
    }
    this_00 = &local_1d8;
  }
  else {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8._M_string_length;
    local_1d8._M_string_length = CONCAT71(local_1d8._M_string_length._1_7_,1);
    local_1b0._0_4_ = 0;
    local_1b0._4_4_ = 0;
    local_1f8._M_string_length = (size_type)&local_1f8.field_2;
    local_1f8._M_dataplus._M_p._0_1_ = 1;
    local_1f8.field_2._M_allocated_capacity = 0x100000001;
    local_180 = (undefined1  [8])(local_180 + 8);
    local_178[0] = '\x01';
    local_178._8_8_ = &local_168;
    local_168._M_allocated_capacity._0_4_ = 1;
    local_168._M_allocated_capacity._4_4_ = 1;
    local_190.m_ptr = (Vector<bool,_4> *)0x0;
    BlendState::BlendState
              (&local_100,(Maybe<bool> *)&local_1d8,
               (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                *)local_1b0,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_180,&local_190);
    auVar5 = local_180;
    if (local_180 != (undefined1  [8])0x0) {
      *(char *)local_180 = '\x01';
      pcVar1 = (char *)((long)auVar5 + 8);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_allocated_capacity = 0;
    local_1b0._0_4_ = 0x40;
    local_1b0._4_4_ = 0x40;
    local_1d8._M_dataplus._M_p = (pointer)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_180,true,(IVec2 *)local_1b0,drawBufferState,
               (TextureFormat *)&local_1d8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)&local_1f8,(DrawBufferInfo *)local_180);
    if (local_138 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_138->m_isFirst = true;
      (local_138->field_1).m_first = (BlendFunc *)0x0;
    }
    if (local_158 !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      local_158->m_isFirst = true;
      (local_158->field_1).m_first = (uint *)0x0;
    }
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_180,name,(allocator<char> *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,name,(allocator<char> *)&local_190);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,local_1b8,&local_100,commonState,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                *)&local_1f8,(string *)local_180,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if (local_180 != (undefined1  [8])(local_178 + 8)) {
      operator_delete((void *)local_180,(ulong)(local_178._8_8_ + 1));
    }
    this_00 = &local_1f8;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             *)this_00);
  if (local_100.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_100.blendFunc.m_ptr)->m_isFirst = true;
    ((local_100.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_100.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_100.blendEq.m_ptr)->m_isFirst = true;
    ((local_100.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  if (local_98.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_98.blendFunc.m_ptr)->m_isFirst = true;
    ((local_98.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_98.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_98.blendEq.m_ptr)->m_isFirst = true;
    ((local_98.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  return &this->super_TestCase;
}

Assistant:

TestCase* createAdvancedEqDiffTest (Context& context, PrePost prepost, const char* name, const BlendState& commonState, const BlendState& drawBufferState)
{
	const BlendState emptyState = BlendState(tcu::nothing<bool>(), tcu::nothing<Either<BlendEq, SeparateBlendEq> >(), tcu::nothing<Either<BlendFunc, SeparateBlendFunc> >(), tcu::nothing<BVec4>());

	if (prepost == PRE)
	{
		const BlendState		preState	= BlendState((commonState.enableBlend ? commonState.enableBlend : just(true)),
														 commonState.blendEq,
														 (commonState.blendFunc ? commonState.blendFunc : just(Either<BlendFunc, SeparateBlendFunc>(BlendFunc(GL_ONE, GL_ONE)))),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, emptyState, drawBuffers, name, name);
	}
	else if (prepost == POST)
	{
		const BlendState		preState	= BlendState(just(true),
														 tcu::nothing<Either<BlendEq, SeparateBlendEq> >(),
														 Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_ONE, GL_ONE)),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, commonState, drawBuffers, name, name);
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}